

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  void *pvVar10;
  _func_void *p_Var11;
  size_t sVar12;
  char *pcVar13;
  void **__s;
  char *zBuf;
  byte *pbVar14;
  ulong uVar15;
  long lVar16;
  u64 uVar17;
  uchar uVar18;
  uchar uVar19;
  void *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_38 = (void *)0x0;
  sVar8 = strlen(zFile);
  if (pzErrMsg == (char **)0x0) {
    iVar5 = 1;
    if ((db->flags & 0x10000) != 0) goto LAB_0013d8de;
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x10000) == 0) {
      pcVar9 = sqlite3_mprintf("not authorized");
      *pzErrMsg = pcVar9;
      goto LAB_0013d8c3;
    }
LAB_0013d8de:
    pcVar9 = "sqlite3_extension_init";
    if (zProc != (char *)0x0) {
      pcVar9 = zProc;
    }
    if (0x1000 < sVar8) {
LAB_0013d8f9:
      iVar5 = 1;
      if (pzErrMsg != (char **)0x0) {
        iVar7 = sqlite3_initialize();
        if (iVar7 == 0) {
          pcVar9 = (char *)sqlite3Malloc(sVar8 + 300);
          *pzErrMsg = pcVar9;
          if (pcVar9 != (char *)0x0) {
            sqlite3_snprintf((int)(sVar8 + 300),pcVar9,"unable to open shared library [%.*s]",0x1000
                             ,zFile);
            (*psVar3->xDlError)(psVar3,(int)sVar8 + 299,pcVar9);
          }
        }
        else {
          *pzErrMsg = (char *)0x0;
        }
      }
      goto LAB_0013dbbb;
    }
    pvVar10 = (*psVar3->xDlOpen)(psVar3,zFile);
    if (pvVar10 == (void *)0x0) {
      pcVar13 = sqlite3_mprintf("%s.%s",zFile,"so");
      if (pcVar13 != (char *)0x0) {
        pvVar10 = (*psVar3->xDlOpen)(psVar3,pcVar13);
        sqlite3_free(pcVar13);
        if (pvVar10 == (void *)0x0) goto LAB_0013d8f9;
        goto LAB_0013d939;
      }
LAB_0013dbb5:
      iVar5 = 7;
      goto LAB_0013dbbb;
    }
LAB_0013d939:
    p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,pcVar9);
    uVar4 = 0;
    if (zProc == (char *)0x0 && p_Var11 == (_func_void *)0x0) {
      if (zFile != (char *)0x0) {
        sVar12 = strlen(zFile);
        uVar4 = (uint)sVar12 & 0x3fffffff;
      }
      iVar5 = sqlite3_initialize();
      if ((iVar5 != 0) ||
         (pcVar13 = (char *)sqlite3Malloc((ulong)(uVar4 + 0x1e)), pcVar13 == (char *)0x0)) {
        (*psVar3->xDlClose)(psVar3,pvVar10);
        goto LAB_0013dbb5;
      }
      builtin_strncpy(pcVar13,"sqlite3_",8);
      uVar15 = (ulong)uVar4;
      do {
        if ((long)uVar15 < 1) {
          uVar6 = 0;
          uVar4 = uVar6;
          if (zFile == (char *)0x0) goto LAB_0013dcc9;
          goto LAB_0013dbf5;
        }
        uVar1 = uVar15 - 1;
        lVar16 = uVar15 - 1;
        uVar15 = uVar1;
      } while (zFile[lVar16] != '/');
      uVar6 = (int)uVar1 + 1;
LAB_0013dbf5:
      lVar16 = 0;
      do {
        if ((ulong)(byte)zFile[lVar16 + (ulong)uVar6] == 0) {
          uVar19 = ""[(byte)"dylib"[lVar16 + 2]];
          uVar18 = '\0';
LAB_0013dcba:
          uVar4 = uVar6 + 3;
          if (uVar18 != uVar19) {
            uVar4 = uVar6;
          }
          goto LAB_0013dcc9;
        }
        uVar18 = ""[(byte)zFile[lVar16 + (ulong)uVar6]];
        uVar19 = ""[(byte)"dylib"[lVar16 + 2]];
        if (uVar18 != uVar19) goto LAB_0013dcba;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      uVar4 = uVar6 + 3;
LAB_0013dcc9:
      iVar5 = 8;
      for (pbVar14 = (byte *)(zFile + (int)uVar4); (bVar2 = *pbVar14, bVar2 != 0 && (bVar2 != 0x2e))
          ; pbVar14 = pbVar14 + 1) {
        if ((""[bVar2] & 2) != 0) {
          lVar16 = (long)iVar5;
          iVar5 = iVar5 + 1;
          pcVar13[lVar16] = ""[(uint)(int)(char)bVar2];
        }
      }
      (pcVar13 + (long)iVar5 + 4)[0] = 't';
      (pcVar13 + (long)iVar5 + 4)[1] = '\0';
      builtin_strncpy(pcVar13 + iVar5,"_ini",4);
      p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,pcVar13);
      pcVar9 = pcVar13;
    }
    else {
      pcVar13 = (char *)0x0;
    }
    if (p_Var11 == (_func_void *)0x0) {
      if (pzErrMsg != (char **)0x0) {
        sVar12 = strlen(pcVar9);
        iVar5 = sqlite3_initialize();
        if (iVar5 == 0) {
          uVar17 = sVar8 + sVar12 + 300;
          zBuf = (char *)sqlite3Malloc(uVar17);
          *pzErrMsg = zBuf;
          if (zBuf != (char *)0x0) {
            iVar5 = (int)uVar17;
            sqlite3_snprintf(iVar5,zBuf,"no entry point [%s] in shared library [%s]",pcVar9,zFile);
            (*psVar3->xDlError)(psVar3,iVar5 + -1,zBuf);
          }
        }
        else {
          *pzErrMsg = (char *)0x0;
        }
      }
      (*psVar3->xDlClose)(psVar3,pvVar10);
      sqlite3_free(pcVar13);
LAB_0013d8c3:
      iVar5 = 1;
    }
    else {
      sqlite3_free(pcVar13);
      iVar5 = (*p_Var11)(db,&local_38,&sqlite3Apis);
      if (iVar5 == 0) {
        uVar17 = (long)db->nExtension * 8 + 8;
        __s = (void **)sqlite3DbMallocRawNN(db,uVar17);
        if (__s == (void **)0x0) goto LAB_0013dbb5;
        memset(__s,0,uVar17);
        if (0 < (long)db->nExtension) {
          memcpy(__s,db->aExtension,(long)db->nExtension << 3);
        }
        if (db->aExtension != (void **)0x0) {
          sqlite3DbFreeNN(db,db->aExtension);
        }
        db->aExtension = __s;
        iVar5 = db->nExtension;
        db->nExtension = iVar5 + 1;
        __s[iVar5] = pvVar10;
      }
      else if (iVar5 != 0x100) {
        if (pzErrMsg != (char **)0x0) {
          pcVar9 = sqlite3_mprintf("error during initialization: %s",local_38);
          *pzErrMsg = pcVar9;
        }
        sqlite3_free(local_38);
        (*psVar3->xDlClose)(psVar3,pvVar10);
        goto LAB_0013d8c3;
      }
      iVar5 = 0;
      iVar7 = 0;
      if (db->mallocFailed == '\0') goto LAB_0013dbc9;
    }
  }
LAB_0013dbbb:
  iVar7 = apiHandleError(db,iVar5);
LAB_0013dbc9:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar7;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}